

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoiraDasm_cpp.h
# Opt level: O3

void __thiscall
moira::Moira::dasmBcc<(moira::Instr)14,(moira::Mode)12,4>
          (Moira *this,StrWriter *str,u32 *addr,u16 op)

{
  u32 uVar1;
  Syntax SVar2;
  int iVar3;
  uint uVar4;
  long lVar5;
  StrWriter *this_00;
  char cVar6;
  char *pcVar7;
  UInt u;
  
  uVar1 = *addr;
  *addr = uVar1 + 2;
  iVar3 = (*this->_vptr_Moira[6])();
  *addr = *addr + 2;
  uVar4 = (*this->_vptr_Moira[6])(this);
  u.raw = iVar3 * 0x10000 + uVar1 + 2 + (uVar4 & 0xffff);
  SVar2 = str->style->syntax;
  if (1 < SVar2 - GNU) {
    cVar6 = 'b';
    if (SVar2 == MUSASHI) {
      lVar5 = 1;
      do {
        pcVar7 = str->ptr;
        str->ptr = pcVar7 + 1;
        *pcVar7 = cVar6;
        cVar6 = "fdbeq"[lVar5 + 2];
        lVar5 = lVar5 + 1;
      } while (lVar5 != 4);
      if ((str->style->syntax & ~MOIRA_MIT) == GNU) {
        pcVar7 = str->ptr;
        str->ptr = pcVar7 + 1;
        *pcVar7 = ' ';
      }
      else {
        iVar3 = (str->tab).raw;
        pcVar7 = str->ptr;
        do {
          str->ptr = pcVar7 + 1;
          *pcVar7 = ' ';
          pcVar7 = str->ptr;
        } while (pcVar7 < str->base + iVar3);
      }
      StrWriter::operator<<(str,u);
      if ((str->style->syntax & ~MOIRA_MIT) != GNU) {
        cVar6 = ';';
        lVar5 = 1;
        do {
          pcVar7 = str->ptr;
          str->ptr = pcVar7 + 1;
          *pcVar7 = cVar6;
          cVar6 = "trap%-2s  ; (2+)"[lVar5 + 10];
          lVar5 = lVar5 + 1;
        } while (lVar5 != 7);
      }
    }
    else {
      lVar5 = 1;
      do {
        pcVar7 = str->ptr;
        str->ptr = pcVar7 + 1;
        *pcVar7 = cVar6;
        cVar6 = "fdbeq"[lVar5 + 2];
        lVar5 = lVar5 + 1;
      } while (lVar5 != 4);
      if ((str->style->syntax & ~MOIRA_MIT) == GNU) {
        pcVar7 = str->ptr;
        str->ptr = pcVar7 + 1;
        *pcVar7 = ' ';
      }
      else {
        iVar3 = (str->tab).raw;
        pcVar7 = str->ptr;
        do {
          str->ptr = pcVar7 + 1;
          *pcVar7 = ' ';
          pcVar7 = str->ptr;
        } while (pcVar7 < str->base + iVar3);
      }
      StrWriter::operator<<(str,u);
      if ((str->style->syntax & ~MOIRA_MIT) != GNU) {
        cVar6 = ';';
        lVar5 = 1;
        do {
          pcVar7 = str->ptr;
          str->ptr = pcVar7 + 1;
          *pcVar7 = cVar6;
          cVar6 = "trap%-2s  ; (2+)"[lVar5 + 10];
          lVar5 = lVar5 + 1;
        } while (lVar5 != 7);
      }
    }
    return;
  }
  cVar6 = 'b';
  lVar5 = 1;
  do {
    pcVar7 = str->ptr;
    str->ptr = pcVar7 + 1;
    *pcVar7 = cVar6;
    cVar6 = "fdbeq"[lVar5 + 2];
    lVar5 = lVar5 + 1;
  } while (lVar5 != 4);
  this_00 = StrWriter::operator<<(str);
  if ((this_00->style->syntax & ~MOIRA_MIT) == GNU) {
    pcVar7 = this_00->ptr;
    this_00->ptr = pcVar7 + 1;
    *pcVar7 = ' ';
  }
  else {
    iVar3 = (str->tab).raw;
    pcVar7 = this_00->ptr;
    do {
      this_00->ptr = pcVar7 + 1;
      *pcVar7 = ' ';
      pcVar7 = this_00->ptr;
    } while (pcVar7 < this_00->base + iVar3);
  }
  StrWriter::operator<<(this_00,u);
  return;
}

Assistant:

void
Moira::dasmBcc(StrWriter &str, u32 &addr, u16 op) const
{
    u32 dst = addr;
    U32_INC(dst, 2);
    U32_INC(dst, S == Byte ? (i8)op : SEXT<S>(dasmIncRead<S>(addr)));

    switch (str.style.syntax) {

        case  Syntax::MUSASHI:

            if (S == Byte && (u8)op == 0xFF) {

                dasmIllegal<I, M, S>(str, addr, op);
                break;
            }

            str << Ins<I>{} << str.tab << UInt(dst) << Av<I, M, S>{};
            break;

        case Syntax::GNU:
        case Syntax::GNU_MIT:

            str << Ins<I>{} << Szb<S>{} << str.tab << UInt(dst);
            break;

        default:

            str << Ins<I>{} << str.tab << UInt(dst) << Av<I, M, S>{};
            break;
    }
}